

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImGuiNextWindowData::ImGuiNextWindowData(ImGuiNextWindowData *this)

{
  *(undefined8 *)((long)&(this->SizeVal).x + 1) = 0;
  *(undefined8 *)((long)&(this->ContentSizeVal).x + 1) = 0;
  *(undefined8 *)&(this->PosVal).y = 0;
  *(undefined8 *)&(this->PosPivotVal).y = 0;
  this->SizeConstraintCond = 0;
  this->FocusCond = 0;
  this->BgAlphaCond = 0;
  (this->PosVal).x = 0.0;
  this->PosCond = 0;
  this->SizeCond = 0;
  this->ContentSizeCond = 0;
  this->CollapsedCond = 0;
  (this->SizeConstraintRect).Min.x = 3.4028235e+38;
  (this->SizeConstraintRect).Min.y = 3.4028235e+38;
  (this->SizeConstraintRect).Max.x = -3.4028235e+38;
  (this->SizeConstraintRect).Max.y = -3.4028235e+38;
  this->SizeCallback = (ImGuiSizeCallback)0x0;
  this->SizeCallbackUserData = (void *)0x0;
  this->BgAlphaVal = 3.4028235e+38;
  (this->MenuBarOffsetMinVal).x = 0.0;
  (this->MenuBarOffsetMinVal).y = 0.0;
  return;
}

Assistant:

ImGuiNextWindowData()
    {
        PosCond = SizeCond = ContentSizeCond = CollapsedCond = SizeConstraintCond = FocusCond = BgAlphaCond = 0;
        PosVal = PosPivotVal = SizeVal = ImVec2(0.0f, 0.0f);
        ContentSizeVal = ImVec2(0.0f, 0.0f);
        CollapsedVal = false;
        SizeConstraintRect = ImRect();
        SizeCallback = NULL;
        SizeCallbackUserData = NULL;
        BgAlphaVal = FLT_MAX;
        MenuBarOffsetMinVal = ImVec2(0.0f, 0.0f);
    }